

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_manager.cpp
# Opt level: O0

void __thiscall
jessilib::io::command_manager::unregister_command(command_manager *this,basic_command *in_command)

{
  mutex_type *local_28;
  lock_guard<std::shared_mutex> local_20;
  lock_guard<std::shared_mutex> guard;
  basic_command *in_command_local;
  command_manager *this_local;
  
  guard._M_device = (mutex_type *)in_command;
  std::lock_guard<std::shared_mutex>::lock_guard(&local_20,&this->m_commands_mutex);
  local_28 = guard._M_device;
  std::
  erase<jessilib::io::basic_command*,std::allocator<jessilib::io::basic_command*>,jessilib::io::basic_command*>
            (&this->m_commands,(basic_command **)&local_28);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void command_manager::unregister_command(basic_command& in_command) {
	std::lock_guard<std::shared_mutex> guard{ m_commands_mutex };
	std::erase(m_commands, &in_command);
}